

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

IndirOpnd * __thiscall IR::IndirOpnd::CopyInternal(IndirOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IndirOpnd *this_00;
  IndirOpnd *newOpnd;
  Func *func_local;
  IndirOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xa18,"(m_kind == OpndKindIndir)","m_kind == OpndKindIndir");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = New(this->m_baseOpnd,this->m_indexOpnd,this->m_scale,(this->super_Opnd).m_type,func);
  (this_00->super_Opnd).m_valueType.field_0 = (this->super_Opnd).m_valueType.field_0;
  (this_00->super_Opnd).field_0xb =
       (this_00->super_Opnd).field_0xb & 0xef | ((byte)(this->super_Opnd).field_0xb >> 4 & 1) << 4;
  SetOffset(this_00,this->m_offset,(bool)((this->super_Opnd).field_0xe & 1));
  bVar2 = Opnd::GetIsJITOptimizedReg(&this->super_Opnd);
  Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,bVar2);
  this_00->m_conversionAllowed = (bool)(this->m_conversionAllowed & 1);
  this_00->m_addrKind = this->m_addrKind;
  this_00->m_originalAddress = this->m_originalAddress;
  return this_00;
}

Assistant:

IndirOpnd *
IndirOpnd::CopyInternal(Func *func)
{
    Assert(m_kind == OpndKindIndir);
    IndirOpnd * newOpnd;

    newOpnd = IndirOpnd::New(m_baseOpnd, m_indexOpnd, m_scale, m_type, func);

    newOpnd->m_valueType = m_valueType;
    newOpnd->canStoreTemp = this->canStoreTemp;
    newOpnd->SetOffset(m_offset, m_dontEncode);
    newOpnd->SetIsJITOptimizedReg(this->GetIsJITOptimizedReg());
    newOpnd->m_conversionAllowed = this->m_conversionAllowed;

#if DBG_DUMP
    newOpnd->m_addrKind = m_addrKind;
    newOpnd->m_originalAddress = m_originalAddress;
#endif
    return newOpnd;
}